

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEditPrivate::clearSection(QDateTimeEditPrivate *this,int index)

{
  int iVar1;
  int iVar2;
  QString *text;
  QObject *in_RDI;
  long in_FS_OFFSET;
  int size;
  int pos;
  int cursorPos;
  char16_t space;
  QString t;
  QSignalBlocker blocker;
  char *in_stack_ffffffffffffff58;
  QSignalBlocker *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QChar local_6a;
  undefined1 local_68 [24];
  char local_50 [32];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QLineEdit::cursorPosition((QLineEdit *)in_stack_ffffffffffffff60);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker
            ((QSignalBlocker *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_RDI)
  ;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QLineEdit *)in_RDI);
  iVar1 = QDateTimeParser::sectionPos((int)in_RDI + 0x3d8);
  if (iVar1 == -1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (char *)in_RDI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
               in_stack_ffffffffffffff58);
    QMessageLogger::warning
              (local_50,"QDateTimeEdit: Internal error (%s:%d)",
               "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qdatetimeedit.cpp"
               ,0x7be);
  }
  else {
    iVar2 = QDateTimeParser::sectionSize((int)in_RDI + 0x3d8);
    text = (QString *)(long)iVar1;
    in_stack_ffffffffffffff60 = (QSignalBlocker *)(long)iVar2;
    QString::QString((QString *)0x55bbef);
    QChar::QChar<char16_t,_true>(&local_6a,L' ');
    QString::fill((QChar *)local_68,(ulong)(ushort)local_6a.ucs);
    QString::replace((longlong)&local_30,(longlong)text,(QString *)in_stack_ffffffffffffff60);
    QString::~QString((QString *)0x55bc32);
    QLineEdit::setText((QLineEdit *)in_stack_ffffffffffffff60,text);
    QLineEdit::setCursorPosition((QLineEdit *)in_stack_ffffffffffffff60,(int)((ulong)text >> 0x20));
  }
  QString::~QString((QString *)0x55bc6f);
  QSignalBlocker::~QSignalBlocker(in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::clearSection(int index)
{
    const auto space = u' ';
    int cursorPos = edit->cursorPosition();
    const QSignalBlocker blocker(edit);
    QString t = edit->text();
    const int pos = sectionPos(index);
    if (Q_UNLIKELY(pos == -1)) {
        qWarning("QDateTimeEdit: Internal error (%s:%d)", __FILE__, __LINE__);
        return;
    }
    const int size = sectionSize(index);
    t.replace(pos, size, QString().fill(space, size));
    edit->setText(t);
    edit->setCursorPosition(cursorPos);
    QDTEDEBUG << cursorPos;
}